

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InertiaNonLinearParametrization.cpp
# Opt level: O2

void __thiscall
iDynTree::RigidBodyInertiaNonLinearParametrization::fromRigidBodyInertia
          (RigidBodyInertiaNonLinearParametrization *this,SpatialInertia *inertia)

{
  double dVar1;
  RotationalInertia *local_238 [2];
  Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_> local_228 [4];
  RotationalInertia inertiaAtCOM;
  JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2> eigenValuesSolver;
  
  dVar1 = SpatialInertia::getMass(inertia);
  this->mass = dVar1;
  SpatialInertia::getCenterOfMass((Position *)&eigenValuesSolver,inertia);
  Position::operator=(&this->com,(Position *)&eigenValuesSolver);
  SpatialInertia::getRotationalInertiaWrtCenterOfMass(&inertiaAtCOM,inertia);
  eigenValuesSolver.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>_>.
  m_computationOptions = 0;
  eigenValuesSolver.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>_>.m_info
       = Success;
  eigenValuesSolver.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>_>.
  m_isInitialized = false;
  eigenValuesSolver.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>_>.
  m_isAllocated = false;
  eigenValuesSolver.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>_>.
  m_usePrescribedThreshold = false;
  eigenValuesSolver.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>_>.
  m_computeFullU = false;
  eigenValuesSolver.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>_>.
  m_computeThinU = false;
  eigenValuesSolver.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>_>.
  m_computeFullV = false;
  eigenValuesSolver.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>_>.
  m_computeThinV = false;
  eigenValuesSolver.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>_>.m_rows
  ._0_4_ = 0xffffffff;
  eigenValuesSolver.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>_>.m_rows
  ._4_4_ = 0xffffffff;
  eigenValuesSolver.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>_>.m_cols
  ._0_4_ = 0xffffffff;
  eigenValuesSolver.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>_>.m_cols
  ._4_4_ = 0xffffffff;
  eigenValuesSolver.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>_>.
  m_diagSize = 0;
  local_238[0] = &inertiaAtCOM;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)local_228,
             (DenseBase<Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
              *)local_238);
  Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>::compute
            (&eigenValuesSolver,(MatrixType *)local_228,0x14);
  (this->centralSecondMomentOfMass).m_data[0] =
       ((eigenValuesSolver.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>_>
         .m_singularValues.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[1] +
        eigenValuesSolver.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>_>.
        m_singularValues.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
        m_data.array[2]) -
       eigenValuesSolver.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>_>.
       m_singularValues.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
       m_data.array[0]) * 0.5;
  (this->centralSecondMomentOfMass).m_data[1] =
       ((eigenValuesSolver.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>_>
         .m_singularValues.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[0] +
        eigenValuesSolver.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>_>.
        m_singularValues.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
        m_data.array[2]) -
       eigenValuesSolver.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>_>.
       m_singularValues.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
       m_data.array[1]) * 0.5;
  (this->centralSecondMomentOfMass).m_data[2] =
       ((eigenValuesSolver.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>_>
         .m_singularValues.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
         m_data.array[1] +
        eigenValuesSolver.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>_>.
        m_singularValues.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
        m_data.array[0]) -
       eigenValuesSolver.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_2>_>.
       m_singularValues.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
       m_data.array[2]) * 0.5;
  local_228[0]._0_8_ = &this->link_R_centroidal;
  Eigen::internal::
  call_assignment<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>,Eigen::Matrix<double,3,3,0,3,3>>
            (local_228,(Matrix<double,_3,_3,_0,_3,_3> *)&eigenValuesSolver);
  return;
}

Assistant:

void RigidBodyInertiaNonLinearParametrization::fromRigidBodyInertia(const SpatialInertia& inertia)
{
    using namespace Eigen;

    // We get the mass and the center of mass
    this->mass = inertia.getMass();

    this->com = inertia.getCenterOfMass();

    // We get the inertia at the COM
    RotationalInertia inertiaAtCOM = inertia.getRotationalInertiaWrtCenterOfMass();

    // We get the inertia at the principal axis using eigen
    JacobiSVD<Matrix<double,3,3,RowMajor> > eigenValuesSolver;

    // We check both the positive definitiveness of the matrix and the triangle
    // inequality by directly checking the central second moment of mass of the rigid body
    // In a nutshell, we have that:
    // Ixx = Cyy + Czz
    // Iyy = Cxx + Czz
    // Izz = Cxx + Cyy
    // so
    // Cxx = (Iyy + Izz - Ixx)/2
    // Cyy = (Ixx + Izz - Iyy)/2
    // Czz = (Ixx + Iyy - Izz)/2
    // Then all the condition boils down to:
    // Cxx >= 0 , Cyy >= 0 , Czz >= 0
    eigenValuesSolver.compute( toEigen(inertiaAtCOM) , Eigen::ComputeFullU | Eigen::ComputeFullV);

    double Ixx = eigenValuesSolver.singularValues()(0);
    double Iyy = eigenValuesSolver.singularValues()(1);
    double Izz = eigenValuesSolver.singularValues()(2);

    double Cxx = (Iyy + Izz - Ixx)/2;
    double Cyy = (Ixx + Izz - Iyy)/2;
    double Czz = (Ixx + Iyy - Izz)/2;

    this->centralSecondMomentOfMass(0) = Cxx;
    this->centralSecondMomentOfMass(1) = Cyy;
    this->centralSecondMomentOfMass(2) = Czz;

    toEigen(this->link_R_centroidal) = eigenValuesSolver.matrixU();
}